

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool kj::tryCopyDirectoryEntry
               (Directory *to,PathPtr toPath,WriteMode toMode,ReadableDirectory *from,
               PathPtr fromPath,Type type,bool atomic)

{
  int iVar1;
  Own<const_kj::ReadableFile> *pOVar2;
  Replacer<kj::File> *pRVar3;
  undefined4 extraout_var;
  RefOrVoid<const_kj::ReadableFile> pRVar4;
  unsigned_long uVar5;
  Own<const_kj::File> *pOVar6;
  File *pFVar7;
  Own<const_kj::ReadableDirectory> *pOVar8;
  Replacer<kj::Directory> *pRVar9;
  undefined4 extraout_var_00;
  RefOrVoid<const_kj::ReadableDirectory> pRVar10;
  Own<const_kj::Directory> *pOVar11;
  RefOrVoid<const_kj::Directory> to_00;
  NullableValue<kj::String> *other;
  String *pSVar12;
  size_t sVar13;
  String *pSVar14;
  Fault local_1e0;
  Fault f;
  size_t local_1d0;
  Maybe<kj::String> local_1a8;
  undefined1 local_188 [8];
  NullableValue<kj::String> content;
  Maybe<kj::Own<const_kj::Directory>_> local_158;
  undefined1 local_148 [8];
  OwnOwn<const_kj::Directory> toSubdir;
  undefined1 local_128 [8];
  Own<kj::Directory::Replacer<kj::Directory>_> replacer_1;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> local_108;
  undefined1 local_f8 [8];
  OwnOwn<const_kj::ReadableDirectory> fromSubdir;
  Maybe<kj::Own<const_kj::File>_> local_d0;
  undefined1 local_c0 [8];
  OwnOwn<const_kj::File> toFile;
  undefined1 local_98 [8];
  Own<kj::Directory::Replacer<kj::File>_> replacer;
  Maybe<kj::Own<const_kj::ReadableFile>_> local_60;
  undefined1 local_50 [8];
  OwnOwn<const_kj::ReadableFile> fromFile;
  bool atomic_local;
  Type type_local;
  ReadableDirectory *from_local;
  WriteMode toMode_local;
  Directory *to_local;
  PathPtr toPath_local;
  
  sVar13 = toPath.parts.size_;
  pSVar14 = toPath.parts.ptr;
  fromFile.value.ptr._3_1_ = atomic;
  to_local._0_4_ = toPath.parts.ptr._0_4_;
  to_local._4_4_ = toPath.parts.ptr._4_4_;
  pSVar12 = fromPath.parts.ptr;
  fromFile.value.ptr._4_4_ = type;
  if (type == FILE) {
    (*(from->super_FsNode)._vptr_FsNode[10])(&local_60,from,fromPath.parts.ptr,fromPath.parts.size_)
    ;
    _::readMaybe<kj::ReadableFile_const>((_ *)local_50,&local_60);
    Maybe<kj::Own<const_kj::ReadableFile>_>::~Maybe(&local_60);
    pOVar2 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_50);
    if (pOVar2 == (Own<const_kj::ReadableFile> *)0x0) {
      toPath_local.parts.size_._7_1_ = false;
      toFile.value.ptr._4_4_ = 1;
    }
    else if ((fromFile.value.ptr._3_1_ & 1) == 0) {
      fromSubdir.value.ptr._0_4_ = to_local._0_4_;
      fromSubdir.value.ptr._4_4_ = to_local._4_4_;
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                (&local_d0,to,pSVar14,sVar13,(ulong)toMode);
      _::readMaybe<kj::File_const>((_ *)local_c0,&local_d0);
      Maybe<kj::Own<const_kj::File>_>::~Maybe(&local_d0);
      pOVar6 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_c0);
      toPath_local.parts.size_._7_1_ = pOVar6 != (Own<const_kj::File> *)0x0;
      if (toPath_local.parts.size_._7_1_) {
        pOVar6 = _::OwnOwn<const_kj::File>::operator->((OwnOwn<const_kj::File> *)local_c0);
        pFVar7 = Own<const_kj::File>::get(pOVar6);
        pOVar2 = _::OwnOwn<const_kj::ReadableFile>::operator*
                           ((OwnOwn<const_kj::ReadableFile> *)local_50);
        pRVar4 = Own<const_kj::ReadableFile>::operator*(pOVar2);
        uVar5 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
        (*(pFVar7->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])(pFVar7,0,pRVar4,0,uVar5);
      }
      toFile.value.ptr._4_4_ = 1;
      _::OwnOwn<const_kj::File>::~OwnOwn((OwnOwn<const_kj::File> *)local_c0);
    }
    else {
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xe])
                (local_98,to,pSVar14,sVar13,(ulong)toMode);
      pRVar3 = Own<kj::Directory::Replacer<kj::File>_>::operator->
                         ((Own<kj::Directory::Replacer<kj::File>_> *)local_98);
      iVar1 = (**pRVar3->_vptr_Replacer)();
      pOVar2 = _::OwnOwn<const_kj::ReadableFile>::operator*
                         ((OwnOwn<const_kj::ReadableFile> *)local_50);
      pRVar4 = Own<const_kj::ReadableFile>::operator*(pOVar2);
      uVar5 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x68))
                ((long *)CONCAT44(extraout_var,iVar1),0,pRVar4,0,uVar5);
      pRVar3 = Own<kj::Directory::Replacer<kj::File>_>::operator->
                         ((Own<kj::Directory::Replacer<kj::File>_> *)local_98);
      iVar1 = (*pRVar3->_vptr_Replacer[1])();
      toPath_local.parts.size_._7_1_ = (bool)((byte)iVar1 & 1);
      toFile.value.ptr._4_4_ = 1;
      Own<kj::Directory::Replacer<kj::File>_>::~Own
                ((Own<kj::Directory::Replacer<kj::File>_> *)local_98);
    }
    _::OwnOwn<const_kj::ReadableFile>::~OwnOwn((OwnOwn<const_kj::ReadableFile> *)local_50);
  }
  else if (type == DIRECTORY) {
    replacer_1.ptr._0_4_ = fromPath.parts.ptr._0_4_;
    replacer_1.ptr._4_4_ = fromPath.parts.ptr._4_4_;
    (*(from->super_FsNode)._vptr_FsNode[0xb])(&local_108,from,pSVar12,fromPath.parts.size_);
    _::readMaybe<kj::ReadableDirectory_const>((_ *)local_f8,&local_108);
    Maybe<kj::Own<const_kj::ReadableDirectory>_>::~Maybe(&local_108);
    pOVar8 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_f8);
    if (pOVar8 == (Own<const_kj::ReadableDirectory> *)0x0) {
      toPath_local.parts.size_._7_1_ = false;
      toFile.value.ptr._4_4_ = 1;
    }
    else if ((fromFile.value.ptr._3_1_ & 1) == 0) {
      content.field_1._16_4_ = to_local._0_4_;
      content.field_1._20_4_ = to_local._4_4_;
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                (&local_158,to,pSVar14,sVar13,(ulong)toMode);
      _::readMaybe<kj::Directory_const>((_ *)local_148,&local_158);
      Maybe<kj::Own<const_kj::Directory>_>::~Maybe(&local_158);
      pOVar11 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_148);
      toPath_local.parts.size_._7_1_ = pOVar11 != (Own<const_kj::Directory> *)0x0;
      if (toPath_local.parts.size_._7_1_) {
        pOVar11 = _::OwnOwn<const_kj::Directory>::operator*
                            ((OwnOwn<const_kj::Directory> *)local_148);
        to_00 = Own<const_kj::Directory>::operator*(pOVar11);
        pOVar8 = _::OwnOwn<const_kj::ReadableDirectory>::operator*
                           ((OwnOwn<const_kj::ReadableDirectory> *)local_f8);
        pRVar10 = Own<const_kj::ReadableDirectory>::operator*(pOVar8);
        copyContents(to_00,pRVar10);
      }
      toFile.value.ptr._4_4_ = 1;
      _::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_148);
    }
    else {
      toSubdir.value.ptr._0_4_ = to_local._0_4_;
      toSubdir.value.ptr._4_4_ = to_local._4_4_;
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
                (local_128,to,pSVar14,sVar13,(ulong)toMode);
      pRVar9 = Own<kj::Directory::Replacer<kj::Directory>_>::operator->
                         ((Own<kj::Directory::Replacer<kj::Directory>_> *)local_128);
      iVar1 = (**pRVar9->_vptr_Replacer)();
      pOVar8 = _::OwnOwn<const_kj::ReadableDirectory>::operator*
                         ((OwnOwn<const_kj::ReadableDirectory> *)local_f8);
      pRVar10 = Own<const_kj::ReadableDirectory>::operator*(pOVar8);
      copyContents((Directory *)CONCAT44(extraout_var_00,iVar1),pRVar10);
      pRVar9 = Own<kj::Directory::Replacer<kj::Directory>_>::operator->
                         ((Own<kj::Directory::Replacer<kj::Directory>_> *)local_128);
      iVar1 = (*pRVar9->_vptr_Replacer[1])();
      toPath_local.parts.size_._7_1_ = (bool)((byte)iVar1 & 1);
      toFile.value.ptr._4_4_ = 1;
      Own<kj::Directory::Replacer<kj::Directory>_>::~Own
                ((Own<kj::Directory::Replacer<kj::Directory>_> *)local_128);
    }
    _::OwnOwn<const_kj::ReadableDirectory>::~OwnOwn((OwnOwn<const_kj::ReadableDirectory> *)local_f8)
    ;
  }
  else if (type == SYMLINK) {
    (*(from->super_FsNode)._vptr_FsNode[0xc])
              (&local_1a8,from,fromPath.parts.ptr,fromPath.parts.size_);
    other = _::readMaybe<kj::String>(&local_1a8);
    _::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_188,other);
    Maybe<kj::String>::~Maybe(&local_1a8);
    pSVar12 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_188);
    if (pSVar12 == (String *)0x0) {
      toPath_local.parts.size_._7_1_ = false;
    }
    else {
      pSVar12 = _::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_188);
      StringPtr::StringPtr((StringPtr *)&f,pSVar12);
      iVar1 = (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])
                        (to,pSVar14,sVar13,f.exception,local_1d0,(ulong)toMode);
      toPath_local.parts.size_._7_1_ = (bool)((byte)iVar1 & 1);
    }
    toFile.value.ptr._4_4_ = 1;
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_188);
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::PathPtr&>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,700,FAILED,(char *)0x0,
               "\"can only copy files, directories, and symlinks\", fromPath",
               (char (*) [47])"can only copy files, directories, and symlinks",&fromPath);
    toPath_local.parts.size_._7_1_ = false;
    toFile.value.ptr._4_4_ = 1;
    _::Debug::Fault::~Fault(&local_1e0);
  }
  return toPath_local.parts.size_._7_1_;
}

Assistant:

static bool tryCopyDirectoryEntry(const Directory& to, PathPtr toPath, WriteMode toMode,
                                  const ReadableDirectory& from, PathPtr fromPath,
                                  FsNode::Type type, bool atomic) {
  // TODO(cleanup): Make this reusable?

  switch (type) {
    case FsNode::Type::FILE: {
      KJ_IF_MAYBE(fromFile, from.tryOpenFile(fromPath)) {
        if (atomic) {
          auto replacer = to.replaceFile(toPath, toMode);
          replacer->get().copy(0, **fromFile, 0, kj::maxValue);
          return replacer->tryCommit();
        } else KJ_IF_MAYBE(toFile, to.tryOpenFile(toPath, toMode)) {
          toFile->get()->copy(0, **fromFile, 0, kj::maxValue);
          return true;
        } else {
          return false;
        }
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
    }
    case FsNode::Type::DIRECTORY:
      KJ_IF_MAYBE(fromSubdir, from.tryOpenSubdir(fromPath)) {
        if (atomic) {
          auto replacer = to.replaceSubdir(toPath, toMode);
          copyContents(replacer->get(), **fromSubdir);
          return replacer->tryCommit();
        } else KJ_IF_MAYBE(toSubdir, to.tryOpenSubdir(toPath, toMode)) {
          copyContents(**toSubdir, **fromSubdir);
          return true;
        } else {
          return false;
        }
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
    case FsNode::Type::SYMLINK:
      KJ_IF_MAYBE(content, from.tryReadlink(fromPath)) {
        return to.trySymlink(toPath, *content, toMode);
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
      break;

    default:
      // Note: Unclear whether it's better to throw an error here or just ignore it / log a
      //   warning. Can reconsider when we see an actual use case.
      KJ_FAIL_REQUIRE("can only copy files, directories, and symlinks", fromPath) {
        return false;
      }
  }
}